

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QPoint __thiscall QWidget::mapFrom(QWidget *this,QWidget *parent,QPoint *pos)

{
  long lVar1;
  QPoint QVar2;
  QPointF *in_RDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QPointF *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPointF::QPointF((QPointF *)in_RSI,(QPoint *)in_RDI);
  mapFrom(in_RDI,in_RSI,in_RDX);
  QVar2 = QPointF::toPoint(in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QWidget::mapFrom(const QWidget *parent, const QPoint &pos) const
{
    return mapFrom(parent, QPointF(pos)).toPoint();
}